

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::change_var_parent(Var **var,Var *target,Var *new_var)

{
  VarType VVar1;
  undefined1 local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<kratos::Expr> expr;
  Var *new_var_local;
  Var *target_local;
  Var **var_local;
  
  expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_var;
  VVar1 = Var::type(*var);
  if (VVar1 == Slice) {
    set_slice_var_parent
              (var,target,
               (Var *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,true);
  }
  else {
    VVar1 = Var::type(*var);
    if (VVar1 == Expression) {
      Var::as<kratos::Expr>((Var *)local_30);
      change_var_expr((shared_ptr<kratos::Expr> *)local_30,target,
                      (Var *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,true);
      std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_30);
    }
    else {
      VVar1 = Var::type(*var);
      if (VVar1 == BaseCasted) {
        Var::as<kratos::VarCasted>((Var *)local_50);
        change_cast_parent((shared_ptr<kratos::VarCasted> *)local_50,target,
                           (Var *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
        std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_50);
      }
    }
  }
  return;
}

Assistant:

void change_var_parent(Var *&var, Var *target, Var *new_var) {
    if (var->type() == VarType::Slice) {
        set_slice_var_parent(var, target, new_var, true);
    } else if (var->type() == VarType::Expression) {
        auto expr = var->as<Expr>();
        change_var_expr(expr, target, new_var);
    } else if (var->type() == VarType::BaseCasted) {
        change_cast_parent(var->as<VarCasted>(), target, new_var);
    }
}